

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionDefinition.cpp
# Opt level: O1

void __thiscall Shell::FunctionDefinition::~FunctionDefinition(FunctionDefinition *this)

{
  Entry *pEVar1;
  Def *this_00;
  Def **ppDVar2;
  bool bVar3;
  ulong uVar4;
  Iterator local_38;
  
  local_38._base._last = (this->_defs)._afterLast;
  local_38._base._timestamp = (this->_defs)._timestamp;
  local_38._base._next = (this->_defs)._entries;
  while( true ) {
    bVar3 = ::Lib::DHMap<int,_Shell::FunctionDefinition::Def_*,_Lib::IdentityHash,_Lib::DefaultHash>
            ::Iterator::hasNext(&local_38);
    if (!bVar3) break;
    pEVar1 = local_38._base._next + 1;
    this_00 = (local_38._base._next)->_val;
    local_38._base._next = pEVar1;
    if (this_00 != (Def *)0x0) {
      Def::~Def(this_00);
      operator_delete(this_00,0x40);
    }
  }
  ::Lib::Array<int>::~Array((Array<int> *)&this->_counter);
  ppDVar2 = (this->_safeDefs)._stack;
  if (ppDVar2 != (Def **)0x0) {
    uVar4 = (this->_safeDefs)._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar4 == 0) {
      *ppDVar2 = (Def *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = ppDVar2;
    }
    else if (uVar4 < 0x11) {
      *ppDVar2 = (Def *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = ppDVar2;
    }
    else if (uVar4 < 0x19) {
      *ppDVar2 = (Def *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = ppDVar2;
    }
    else if (uVar4 < 0x21) {
      *ppDVar2 = (Def *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = ppDVar2;
    }
    else if (uVar4 < 0x31) {
      *ppDVar2 = (Def *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = ppDVar2;
    }
    else if (uVar4 < 0x41) {
      *ppDVar2 = (Def *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = ppDVar2;
    }
    else {
      operator_delete(ppDVar2,0x10);
    }
  }
  ppDVar2 = (this->_blockedDefs)._stack;
  if (ppDVar2 != (Def **)0x0) {
    uVar4 = (this->_blockedDefs)._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar4 == 0) {
      *ppDVar2 = (Def *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = ppDVar2;
    }
    else if (uVar4 < 0x11) {
      *ppDVar2 = (Def *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = ppDVar2;
    }
    else if (uVar4 < 0x19) {
      *ppDVar2 = (Def *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = ppDVar2;
    }
    else if (uVar4 < 0x21) {
      *ppDVar2 = (Def *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = ppDVar2;
    }
    else if (uVar4 < 0x31) {
      *ppDVar2 = (Def *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = ppDVar2;
    }
    else if (uVar4 < 0x41) {
      *ppDVar2 = (Def *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = ppDVar2;
    }
    else {
      operator_delete(ppDVar2,0x10);
    }
  }
  ::Lib::DHMap<int,_Shell::FunctionDefinition::Def_*,_Lib::IdentityHash,_Lib::DefaultHash>::~DHMap
            (&this->_defs);
  return;
}

Assistant:

FunctionDefinition::~FunctionDefinition ()
{
  Fn2DefMap::Iterator dit(_defs);
  while(dit.hasNext()) {
    delete dit.next();
  }
}